

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

void walk(object *base,object *top,object *array1,object *array2,int size)

{
  uint uVar1;
  ulong uVar2;
  object *poVar3;
  ulong uVar4;
  ulong uVar5;
  uintptr_t uVar6;
  bool bVar7;
  
  if (base < top) {
    do {
      if (0 < size) {
        uVar2 = 0;
        do {
          poVar3 = (object *)(&array2[1].header)[uVar2];
          if (((object *)(&array1[1].header)[uVar2] == base->class) ||
             (bVar7 = poVar3 == base->class, poVar3 = (object *)(&array1[1].header)[uVar2], bVar7))
          {
            base->class = poVar3;
            break;
          }
          uVar2 = uVar2 + 1;
        } while ((uint)size != uVar2);
      }
      uVar2 = base->header;
      uVar1 = (uint)(uVar2 >> 2) & 0x3fffffff;
      if (base == array1 || base == array2) {
LAB_0010a63e:
        uVar1 = uVar1 << 3;
      }
      else {
        if ((uVar2 & 2) == 0) {
          if (3 < (uint)uVar2) {
            uVar4 = 0;
            do {
              if (0 < size) {
                uVar5 = 0;
                do {
                  uVar6 = (&array2[1].header)[uVar5];
                  if (((&array1[1].header)[uVar5] == (&base[1].header)[uVar4]) ||
                     (bVar7 = uVar6 == (&base[1].header)[uVar4], uVar6 = (&array1[1].header)[uVar5],
                     bVar7)) {
                    (&base[1].header)[uVar4] = uVar6;
                    break;
                  }
                  uVar5 = uVar5 + 1;
                } while ((uint)size != uVar5);
              }
              uVar4 = uVar4 + 1;
            } while (uVar4 != uVar1 + ((uVar2 >> 2 & 0x3fffffff) == 0));
          }
          goto LAB_0010a63e;
        }
        uVar1 = uVar1 + 7 & 0xfffffff8;
      }
      base = (object *)((long)&base->header + (ulong)(uVar1 + 0x10));
    } while (base < top);
  }
  return;
}

Assistant:

static void walk(struct object *base, struct object *top,
                 struct object *array1, struct object *array2, int size)
{
    struct object *op, *opnext;
    int x, sz;

    for (op = base; op < top; op = opnext) {
        /*
         * Re-map the class pointer, in case that's the
         * object which has been remapped.
         */
        map(&op->class, array1, array2, size);

        /*
         * Skip our argument arrays, since otherwise things
         * get rather circular.
         */
        sz = SIZE(op);
        if ((op == array1) || (op == array2)) {
            opnext = WORDSUP(op, sz + 2);
            continue;
        }

        /*
         * Don't have to worry about instance variables
         * if it's a binary format.
         */
        if (IS_BINOBJ(op)) {
            int trueSize;

            /*
             * Skip size/class, and enough words to
             * contain the binary bytes.
             */
            trueSize = TO_WORDS(sz);
            opnext = WORDSUP(op, trueSize + 2);
            continue;
        }

        /*
         * For each instance variable slot, fix up the pointer
         * if needed.
         */
        for (x = 0; x < sz; ++x) {
            map(&op->data[x], array1, array2, size);
        }

        /*
         * Walk past this object
         */
        opnext = WORDSUP(op, sz + 2);
    }
}